

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs_marshal.c
# Opt level: O0

void RecalcMarshalStorageSize(SstStream Stream)

{
  long lVar1;
  void *pvVar2;
  long lVar3;
  long in_RDI;
  size_t NewMetaSize;
  FMFieldList LastMetaField;
  size_t NewDataSize;
  FMFieldList LastDataField;
  FFSWriterMarshalBase *Info;
  
  lVar3 = *(long *)(in_RDI + 0x1c0);
  if (*(int *)(lVar3 + 0x30) != 0) {
    lVar1 = *(long *)(lVar3 + 0x38) + (long)(*(int *)(lVar3 + 0x30) + -1) * 0x18;
    lVar1 = (long)(int)(*(int *)(lVar1 + 0x14) + *(int *)(lVar1 + 0x10) + 7U & 0xfffffff8);
    pvVar2 = realloc(*(void **)(in_RDI + 0x1e0),lVar1 + 8);
    *(void **)(in_RDI + 0x1e0) = pvVar2;
    memset((void *)(*(long *)(in_RDI + 0x1e0) + *(long *)(in_RDI + 0x1d8)),0,
           lVar1 - *(long *)(in_RDI + 0x1d8));
    *(long *)(in_RDI + 0x1d8) = lVar1;
  }
  if (*(int *)(lVar3 + 0x18) != 0) {
    lVar3 = *(long *)(lVar3 + 0x20) + (long)(*(int *)(lVar3 + 0x18) + -1) * 0x18;
    lVar3 = (long)(int)(*(int *)(lVar3 + 0x14) + *(int *)(lVar3 + 0x10) + 7U & 0xfffffff8);
    pvVar2 = realloc(*(void **)(in_RDI + 0x1d0),lVar3 + 8);
    *(void **)(in_RDI + 0x1d0) = pvVar2;
    memset((void *)(*(long *)(in_RDI + 0x1d0) + *(long *)(in_RDI + 0x1c8)),0,
           lVar3 - *(long *)(in_RDI + 0x1c8));
    *(long *)(in_RDI + 0x1c8) = lVar3;
  }
  return;
}

Assistant:

static void RecalcMarshalStorageSize(SstStream Stream)
{
    struct FFSWriterMarshalBase *Info = Stream->WriterMarshalData;
    if (Info->DataFieldCount)
    {
        FMFieldList LastDataField;
        size_t NewDataSize;
        LastDataField = &Info->DataFields[Info->DataFieldCount - 1];
        NewDataSize = (LastDataField->field_offset + LastDataField->field_size + 7) & ~7;
        Stream->D = realloc(Stream->D, NewDataSize + 8);
        memset((char *)(Stream->D) + Stream->DataSize, 0, NewDataSize - Stream->DataSize);
        Stream->DataSize = NewDataSize;
    }
    if (Info->MetaFieldCount)
    {
        FMFieldList LastMetaField;
        size_t NewMetaSize;
        LastMetaField = &Info->MetaFields[Info->MetaFieldCount - 1];
        NewMetaSize = (LastMetaField->field_offset + LastMetaField->field_size + 7) & ~7;
        Stream->M = realloc(Stream->M, NewMetaSize + 8);
        memset((char *)(Stream->M) + Stream->MetadataSize, 0, NewMetaSize - Stream->MetadataSize);
        Stream->MetadataSize = NewMetaSize;
    }
}